

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::visitArrayNewFixed(FunctionValidator *this,ArrayNewFixed *curr)

{
  bool bVar1;
  Module *pMVar2;
  Expression **ppEVar3;
  Expression *value;
  Iterator __end1;
  Iterator __begin1;
  ExpressionList *__range1;
  ExpressionList **local_30;
  Field *element;
  HeapType heapType;
  ArrayNewFixed *curr_local;
  FunctionValidator *this_local;
  
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::ArrayNewFixed*>(this,bVar1,curr,"array.init requires gc [--enable-gc]");
  heapType.id._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.
                      type,(BasicType *)((long)&heapType.id + 4));
  if (!bVar1) {
    element = (Field *)wasm::Type::getHeapType
                                 (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                                   super_Expression.type);
    bVar1 = HeapType::isArray((HeapType *)&element);
    bVar1 = shouldBeTrue<wasm::ArrayNewFixed*>(this,bVar1,curr,"array.init heap type must be array")
    ;
    if (bVar1) {
      HeapType::getArray((HeapType *)&__range1);
      local_30 = &__range1;
      join_0x00000010_0x00000000_ =
           ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                     (&(curr->values).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
      _value = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(curr->values).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
      while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                     ::operator!=((Iterator *)&__end1.index,(Iterator *)&value), bVar1) {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end1.index);
        shouldBeSubType(this,(Type)((*ppEVar3)->type).id,(Type)*local_30,(Expression *)curr,
                        "array.init value must have proper type");
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                  ((Iterator *)&__end1.index);
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNewFixed(ArrayNewFixed* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.init requires gc [--enable-gc]");
  if (curr->type == Type::unreachable) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(), curr, "array.init heap type must be array")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  for (auto* value : curr->values) {
    shouldBeSubType(value->type,
                    element.type,
                    curr,
                    "array.init value must have proper type");
  }
}